

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::ValidationError::ValidationError
          (ValidationError *this,string *ValidationError,string *msg,ExitCodes exit_code)

{
  string local_68;
  string local_48;
  ExitCodes local_24;
  string *psStack_20;
  ExitCodes exit_code_local;
  string *msg_local;
  string *ValidationError_local;
  ValidationError *this_local;
  
  local_24 = exit_code;
  psStack_20 = msg;
  msg_local = ValidationError;
  ValidationError_local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_48,(string *)ValidationError);
  ::std::__cxx11::string::string((string *)&local_68,(string *)msg);
  ParseError::ParseError(&this->super_ParseError,&local_48,&local_68,local_24);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__ValidationError_001cd790;
  return;
}

Assistant:

ValidationError(std::string name, std::string msg) : ValidationError(name + ": " + msg) {}